

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O0

Vec_Bit_t * Acec_MapXorOuts(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int iVar1;
  Vec_Bit_t *p_00;
  undefined4 local_24;
  int i;
  Vec_Bit_t *vMap;
  Vec_Int_t *vXors_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_BitStart(iVar1);
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vXors);
    if (iVar1 <= local_24 << 2) break;
    iVar1 = Vec_IntEntry(vXors,local_24 << 2);
    Vec_BitWriteEntry(p_00,iVar1,1);
    local_24 = local_24 + 1;
  }
  return p_00;
}

Assistant:

Vec_Bit_t * Acec_MapXorOuts( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Bit_t * vMap = Vec_BitStart( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i), 1 );
    return vMap;
}